

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O1

node_type * __thiscall
Tree<NULLC::Range>::insert(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  node_type *y;
  void *pvVar1;
  node_type *pnVar2;
  node<NULLC::Range> *pnVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  if (node == (node_type *)0x0) {
    pnVar3 = TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate(&this->pool);
    pvVar1 = key->end;
    (pnVar3->key).start = key->start;
    (pnVar3->key).end = pvVar1;
    return pnVar3;
  }
  bVar7 = (node->key).start <= key->end;
  pnVar2 = insert(this,(&node->left)[bVar7],key);
  (&node->left)[bVar7] = pnVar2;
  pnVar2 = node->left;
  iVar4 = 0;
  iVar5 = 0;
  if (pnVar2 != (node_type *)0x0) {
    iVar5 = pnVar2->height;
  }
  y = node->right;
  if (y != (node_type *)0x0) {
    iVar4 = y->height;
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  iVar6 = 0;
  node->height = iVar4 + 1;
  iVar5 = 0;
  if (pnVar2 != (node_type *)0x0) {
    iVar5 = pnVar2->height;
  }
  if (y != (node_type *)0x0) {
    iVar6 = y->height;
  }
  iVar5 = iVar5 - iVar6;
  if ((1 < iVar5) && (key->end < (pnVar2->key).start)) {
LAB_00123215:
    pnVar2 = right_rotate(this,node);
    return pnVar2;
  }
  if ((-2 < iVar5) || (key->start <= (y->key).end)) {
    if ((1 < iVar5) && ((pnVar2->key).end < key->start)) {
      pnVar2 = left_rotate(this,pnVar2);
      node->left = pnVar2;
      goto LAB_00123215;
    }
    if (-2 < iVar5) {
      return node;
    }
    if ((y->key).start <= key->end) {
      return node;
    }
    pnVar2 = right_rotate(this,y);
    node->right = pnVar2;
  }
  pnVar2 = left_rotate(this,node);
  return pnVar2;
}

Assistant:

node_type* insert(node_type* node, const T& key)
	{
		if(node == NULL)
		{
			node_type *t = pool.Allocate();
			t->key = key;
			return t;
		}

		if(key < node->key)
			node->left = insert(node->left, key);
		else
			node->right = insert(node->right, key);

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && key < node->left->key)
			return right_rotate(node);

		if(balance < -1 && key > node->right->key)
			return left_rotate(node);

		if(balance > 1 && key > node->left->key)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && key < node->right->key)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}